

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                   (ulong state,uchar *first,ulong len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  size_t sVar11;
  pair<unsigned_long,_unsigned_long> pVar12;
  size_t len_local;
  uchar *first_local;
  uint64_t state_local;
  ulong local_120;
  uint64_t v;
  ulong local_f0;
  pair<unsigned_long,_unsigned_long> p;
  uint64_t m1;
  uchar *tail_16b_ptr;
  uint64_t m0;
  MultType m_2;
  MultType m_1;
  MultType m;
  MultType m_3;
  
  if (len < 9) {
    if (8 < len) {
      __assert_fail("len <= 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/hash/internal/hash.h"
                    ,0x495,
                    "static uint64_t absl::hash_internal::MixingHashState::CombineSmallContiguousImpl(uint64_t, const unsigned char *, size_t)"
                   );
    }
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar8 = Read1To3(first,len);
      local_120 = (ulong)uVar8;
    }
    else {
      local_120 = Read4To8(first,len);
    }
    uVar9 = gbswap_64((state ^ local_120) * -0x234dd359734ecb13);
    return uVar9;
  }
  if (len < 0x11) {
    if (len < 9) {
      __assert_fail("len >= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/hash/internal/hash.h"
                    ,0x4a4,
                    "static uint64_t absl::hash_internal::MixingHashState::CombineContiguousImpl9to16(uint64_t, const unsigned char *, size_t)"
                   );
    }
    if (0x10 < len) {
      __assert_fail("len <= 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/hash/internal/hash.h"
                    ,0x4a5,
                    "static uint64_t absl::hash_internal::MixingHashState::CombineContiguousImpl9to16(uint64_t, const unsigned char *, size_t)"
                   );
    }
    pVar12 = Read9To16(first,len);
    local_f0 = pVar12.first;
    p.first = pVar12.second;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = state ^ local_f0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = p.first ^ 0xdcb22ca68cb134ed;
    return SUB168(auVar1 * auVar5,0) ^ SUB168(auVar1 * auVar5,8);
  }
  if (0x20 < len) {
    sVar11 = PiecewiseChunkSize();
    if (sVar11 < len) {
      uVar9 = CombineLargeContiguousImpl64(state,first,len);
      return uVar9;
    }
    uVar9 = LowLevelHashImpl(first,len);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = state ^ uVar9;
    return SUB168(auVar4 * ZEXT816(0xdcb22ca68cb134ed),0) ^
           SUB168(auVar4 * ZEXT816(0xdcb22ca68cb134ed),8);
  }
  if (len < 0x11) {
    __assert_fail("len >= 17",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/hash/internal/hash.h"
                  ,0x4b1,
                  "static uint64_t absl::hash_internal::MixingHashState::CombineContiguousImpl17to32(uint64_t, const unsigned char *, size_t)"
                 );
  }
  if (0x20 < len) {
    __assert_fail("len <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/hash/internal/hash.h"
                  ,0x4b2,
                  "static uint64_t absl::hash_internal::MixingHashState::CombineContiguousImpl17to32(uint64_t, const unsigned char *, size_t)"
                 );
  }
  uVar9 = Read8(first);
  uVar10 = Read8(first + 8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar9 ^ 0x13198a2e03707344;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar10 ^ state;
  uVar9 = Read8(first + (len - 0x10));
  uVar10 = Read8(first + (len - 0x10) + 8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9 ^ 0x82efa98ec4e6c89;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar10 ^ state;
  return SUB168(auVar2 * auVar6,0) ^ SUB168(auVar2 * auVar6,8) ^
         SUB168(auVar3 * auVar7,0) ^ SUB168(auVar3 * auVar7,8);
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 8> /* sizeof_size_t */) {
  // For large values we use LowLevelHash or CityHash depending on the platform,
  // for small ones we just use a multiplicative hash.
  if (len <= 8) {
    return CombineSmallContiguousImpl(state, first, len);
  }
  if (len <= 16) {
    return CombineContiguousImpl9to16(state, first, len);
  }
  if (len <= 32) {
    return CombineContiguousImpl17to32(state, first, len);
  }
  if (ABSL_PREDICT_TRUE(len <= PiecewiseChunkSize())) {
    return Mix(state ^ Hash64(first, len), kMul);
  }
  return CombineLargeContiguousImpl64(state, first, len);
}